

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

int google::protobuf::compiler::cpp::EstimateSize(FieldDescriptor *field)

{
  bool bVar1;
  int iVar2;
  LogMessageFatal aLStack_18 [16];
  
  if (field == (FieldDescriptor *)0x0) {
    iVar2 = 0;
  }
  else {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      bVar1 = FieldDescriptor::is_map(field);
      if (bVar1) {
        iVar2 = 0x20;
      }
      else if (*(int *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) < 9)
      {
        iVar2 = 0x10;
      }
      else {
        bVar1 = IsCord(field);
        iVar2 = (uint)!bVar1 * 8 + 0x10;
      }
    }
    else {
      switch(*(undefined4 *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4))
      {
      case 1:
      case 3:
      case 6:
      case 8:
        iVar2 = 4;
        break;
      case 2:
      case 4:
      case 5:
      case 10:
        iVar2 = 8;
        break;
      case 7:
        iVar2 = 1;
        break;
      case 9:
        bVar1 = IsCord(field);
        iVar2 = (uint)bVar1 * 8 + 8;
        break;
      default:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (aLStack_18,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/helpers.cc"
                   ,0x282);
        absl::lts_20240722::log_internal::LogMessage::operator<<
                  ((LogMessage *)aLStack_18,(char (*) [16])"Can\'t get here.");
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_18);
      }
    }
  }
  return iVar2;
}

Assistant:

int EstimateSize(const FieldDescriptor* field) {
  if (field == nullptr) return 0;
  if (field->is_repeated()) {
    if (field->is_map()) {
      return sizeof(google::protobuf::Map<int32_t, int32_t>);
    }
    return field->cpp_type() < FieldDescriptor::CPPTYPE_STRING || IsCord(field)
               ? sizeof(RepeatedField<int32_t>)
               : sizeof(internal::RepeatedPtrFieldBase);
  }
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return 1;

    case FieldDescriptor::CPPTYPE_INT32:
    case FieldDescriptor::CPPTYPE_UINT32:
    case FieldDescriptor::CPPTYPE_ENUM:
    case FieldDescriptor::CPPTYPE_FLOAT:
      return 4;

    case FieldDescriptor::CPPTYPE_INT64:
    case FieldDescriptor::CPPTYPE_UINT64:
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return 8;

    case FieldDescriptor::CPPTYPE_STRING:
      if (IsCord(field)) return sizeof(absl::Cord);
      return sizeof(internal::ArenaStringPtr);
  }
  ABSL_LOG(FATAL) << "Can't get here.";
  return -1;  // Make compiler happy.
}